

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall
spdlog::details::registry_t<std::mutex>::drop(registry_t<std::mutex> *this,string *logger_name)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  string *logger_name_local;
  registry_t<std::mutex> *this_local;
  
  lock._M_device = (mutex_type *)logger_name;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mutex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  ::erase(&this->_loggers,(key_type *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void drop(const std::string &logger_name)
    {
        std::lock_guard<Mutex> lock(_mutex);
        _loggers.erase(logger_name);
    }